

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.c
# Opt level: O1

void utilOnExitInit(void)

{
  bool_t bVar1;
  int iVar2;
  
  bVar1 = mtMtxCreate(_mtx);
  if (bVar1 != 0) {
    iVar2 = atexit(utilOnExitRun);
    if (iVar2 != 0) {
      mtMtxClose(_mtx);
      return;
    }
    _inited = 1;
  }
  return;
}

Assistant:

static void utilOnExitInit()
{
	// создать мьютекс
	if (!mtMtxCreate(_mtx))
		return;
	// зарегистрировать обработчик
	if (atexit(utilOnExitRun) != 0)
	{
		mtMtxClose(_mtx);
		return;
	}
	_inited = TRUE;
}